

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::TableFunctionRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,TableFunctionRelation *this,idx_t depth)

{
  reference this_00;
  idx_t depth_00;
  idx_t i;
  ulong __n;
  string function_call;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::operator+(&local_50,&this->name,"(");
  for (__n = 0; __n < (ulong)((long)(this->parameters).
                                    super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->parameters).
                                    super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 6); __n = __n + 1)
  {
    if (__n != 0) {
      ::std::__cxx11::string::append((char *)&local_50);
    }
    this_00 = vector<duckdb::Value,_true>::get<true>(&this->parameters,__n);
    Value::ToString_abi_cxx11_(&local_70,this_00);
    ::std::__cxx11::string::append((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  ::std::__cxx11::string::append((char *)&local_50);
  Relation::RenderWhitespace_abi_cxx11_(&local_70,(Relation *)depth,depth_00);
  ::std::operator+(__return_storage_ptr__,&local_70,&local_50);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

string TableFunctionRelation::ToString(idx_t depth) {
	string function_call = name + "(";
	for (idx_t i = 0; i < parameters.size(); i++) {
		if (i > 0) {
			function_call += ", ";
		}
		function_call += parameters[i].ToString();
	}
	function_call += ")";
	return RenderWhitespace(depth) + function_call;
}